

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

void __thiscall deci::ast_binary_t::~ast_binary_t(ast_binary_t *this)

{
  pointer pcVar1;
  
  if (this->a != (ast_item_t *)0x0) {
    (*this->a->_vptr_ast_item_t[4])();
  }
  if (this->b != (ast_item_t *)0x0) {
    (*this->b->_vptr_ast_item_t[4])();
  }
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->identifier).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3c8;
  return;
}

Assistant:

ast_binary_t::~ast_binary_t() {
    delete this->a;
    delete this->b;
  }